

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O2

void IOcontroller::load_graph_struct(string *graphName,Graph *vecGraph,bool isReverse)

{
  undefined7 in_register_00000011;
  string filename;
  string postfix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,".vec.graph",(allocator *)&bStack_78);
  if ((int)CONCAT71(in_register_00000011,isReverse) != 0) {
    std::__cxx11::string::assign((char *)&local_58);
  }
  std::operator+(&bStack_78,graphName,&local_58);
  std::__cxx11::string::string((string *)&local_38,(string *)&bStack_78);
  load_file<std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>>
            (&local_38,vecGraph);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

static void load_graph_struct(const std::string graphName, Graph& vecGraph, const bool isReverse)
    {
        std::string postfix = ".vec.graph";
        if (isReverse) postfix = ".vec.rvs.graph";
        const std::string filename = graphName + postfix;
        load_file(filename, vecGraph);
    }